

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

int side4_8d_filter(double *p0,double *p1,double *p2,double *p3,double *p4,double *q0,double *q1,
                   double *q2,double *q3)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double local_410;
  double max11;
  double max10;
  double max9;
  double max8;
  double max7;
  int local_3e0;
  int int_tmp_result_FFWKCAA;
  int int_tmp_result;
  int Delta_sign;
  double upper_bound_1;
  double lower_bound_1;
  double max6;
  double max5;
  double max4;
  double max3;
  double max2;
  double max1;
  double eps;
  double r;
  double DeltaLambda3;
  double DeltaLambda2;
  double DeltaLambda1;
  double DeltaLambda0;
  double Delta;
  double b33;
  double b32;
  double b31;
  double b30;
  double b23;
  double b22;
  double b21;
  double b20;
  double b13;
  double b12;
  double b11;
  double b10;
  double b03;
  double b02;
  double b01;
  double b00;
  double a43;
  double a42;
  double a41;
  double a40;
  double a33;
  double a32;
  double a31;
  double a30;
  double a23;
  double a22;
  double a21;
  double a20;
  double a13;
  double q3_7_p0_7;
  double q3_6_p0_6;
  double q3_5_p0_5;
  double q3_4_p0_4;
  double q3_3_p0_3;
  double q3_2_p0_2;
  double q3_1_p0_1;
  double q3_0_p0_0;
  double a12;
  double q2_7_p0_7;
  double q2_6_p0_6;
  double q2_5_p0_5;
  double q2_4_p0_4;
  double q2_3_p0_3;
  double q2_2_p0_2;
  double q2_1_p0_1;
  double q2_0_p0_0;
  double a11;
  double q1_7_p0_7;
  double q1_6_p0_6;
  double q1_5_p0_5;
  double q1_4_p0_4;
  double q1_3_p0_3;
  double q1_2_p0_2;
  double q1_1_p0_1;
  double q1_0_p0_0;
  double a10;
  double q0_7_p0_7;
  double q0_6_p0_6;
  double q0_5_p0_5;
  double q0_4_p0_4;
  double q0_3_p0_3;
  double q0_2_p0_2;
  double q0_1_p0_1;
  double q0_0_p0_0;
  double l4;
  double p4_7_p0_7;
  double p4_6_p0_6;
  double p4_5_p0_5;
  double p4_4_p0_4;
  double p4_3_p0_3;
  double p4_2_p0_2;
  double p4_1_p0_1;
  double p4_0_p0_0;
  double l3;
  double p3_7_p0_7;
  double p3_6_p0_6;
  double p3_5_p0_5;
  double p3_4_p0_4;
  double p3_3_p0_3;
  double p3_2_p0_2;
  double p3_1_p0_1;
  double p3_0_p0_0;
  double l2;
  double p2_7_p0_7;
  double p2_6_p0_6;
  double p2_5_p0_5;
  double p2_4_p0_4;
  double p2_3_p0_3;
  double p2_2_p0_2;
  double p2_1_p0_1;
  double p2_0_p0_0;
  double l1;
  double p1_7_p0_7;
  double p1_6_p0_6;
  double p1_5_p0_5;
  double p1_4_p0_4;
  double p1_3_p0_3;
  double p1_2_p0_2;
  double p1_1_p0_1;
  double p1_0_p0_0;
  double *q0_local;
  double *p4_local;
  double *p3_local;
  double *p2_local;
  double *p1_local;
  double *p0_local;
  
  dVar3 = *p1 - *p0;
  dVar4 = p1[1] - p0[1];
  dVar5 = p1[2] - p0[2];
  dVar6 = p1[3] - p0[3];
  dVar7 = p1[4] - p0[4];
  dVar8 = p1[5] - p0[5];
  dVar9 = p1[6] - p0[6];
  dVar10 = p1[7] - p0[7];
  dVar11 = (dVar10 * dVar10 +
           dVar9 * dVar9 +
           dVar8 * dVar8 +
           dVar7 * dVar7 + dVar6 * dVar6 + dVar5 * dVar5 + dVar3 * dVar3 + dVar4 * dVar4) * 1.0;
  dVar12 = *p2 - *p0;
  dVar13 = p2[1] - p0[1];
  dVar14 = p2[2] - p0[2];
  dVar15 = p2[3] - p0[3];
  dVar16 = p2[4] - p0[4];
  dVar17 = p2[5] - p0[5];
  dVar18 = p2[6] - p0[6];
  dVar19 = p2[7] - p0[7];
  dVar20 = (dVar19 * dVar19 +
           dVar18 * dVar18 +
           dVar17 * dVar17 +
           dVar16 * dVar16 + dVar15 * dVar15 + dVar14 * dVar14 + dVar12 * dVar12 + dVar13 * dVar13)
           * 1.0;
  dVar21 = *p3 - *p0;
  dVar22 = p3[1] - p0[1];
  dVar23 = p3[2] - p0[2];
  dVar24 = p3[3] - p0[3];
  dVar25 = p3[4] - p0[4];
  dVar26 = p3[5] - p0[5];
  dVar27 = p3[6] - p0[6];
  dVar28 = p3[7] - p0[7];
  dVar29 = (dVar28 * dVar28 +
           dVar27 * dVar27 +
           dVar26 * dVar26 +
           dVar25 * dVar25 + dVar24 * dVar24 + dVar23 * dVar23 + dVar21 * dVar21 + dVar22 * dVar22)
           * 1.0;
  dVar30 = *p4 - *p0;
  dVar31 = p4[1] - p0[1];
  dVar32 = p4[2] - p0[2];
  dVar33 = p4[3] - p0[3];
  dVar34 = p4[4] - p0[4];
  dVar35 = p4[5] - p0[5];
  dVar36 = p4[6] - p0[6];
  dVar37 = p4[7] - p0[7];
  dVar38 = *q0 - *p0;
  dVar39 = q0[1] - p0[1];
  dVar40 = q0[2] - p0[2];
  dVar41 = q0[3] - p0[3];
  dVar42 = q0[4] - p0[4];
  dVar43 = q0[5] - p0[5];
  dVar44 = q0[6] - p0[6];
  dVar45 = q0[7] - p0[7];
  dVar46 = (dVar10 * dVar45 +
           dVar9 * dVar44 +
           dVar8 * dVar43 +
           dVar7 * dVar42 + dVar6 * dVar41 + dVar5 * dVar40 + dVar3 * dVar38 + dVar4 * dVar39) * 2.0
  ;
  dVar47 = *q1 - *p0;
  dVar48 = q1[1] - p0[1];
  dVar49 = q1[2] - p0[2];
  dVar50 = q1[3] - p0[3];
  dVar51 = q1[4] - p0[4];
  dVar52 = q1[5] - p0[5];
  dVar53 = q1[6] - p0[6];
  dVar54 = q1[7] - p0[7];
  dVar55 = (dVar10 * dVar54 +
           dVar9 * dVar53 +
           dVar8 * dVar52 +
           dVar7 * dVar51 + dVar6 * dVar50 + dVar5 * dVar49 + dVar3 * dVar47 + dVar4 * dVar48) * 2.0
  ;
  dVar56 = *q2 - *p0;
  dVar57 = q2[1] - p0[1];
  dVar58 = q2[2] - p0[2];
  dVar59 = q2[3] - p0[3];
  dVar60 = q2[4] - p0[4];
  dVar61 = q2[5] - p0[5];
  dVar62 = q2[6] - p0[6];
  dVar63 = q2[7] - p0[7];
  dVar64 = (dVar10 * dVar63 +
           dVar9 * dVar62 +
           dVar8 * dVar61 +
           dVar7 * dVar60 + dVar6 * dVar59 + dVar5 * dVar58 + dVar3 * dVar56 + dVar4 * dVar57) * 2.0
  ;
  dVar65 = *q3 - *p0;
  dVar66 = q3[1] - p0[1];
  dVar67 = q3[2] - p0[2];
  dVar68 = q3[3] - p0[3];
  dVar69 = q3[4] - p0[4];
  dVar70 = q3[5] - p0[5];
  dVar71 = q3[6] - p0[6];
  dVar72 = q3[7] - p0[7];
  dVar73 = (dVar10 * dVar72 +
           dVar9 * dVar71 +
           dVar8 * dVar70 +
           dVar7 * dVar69 + dVar6 * dVar68 + dVar5 * dVar67 + dVar3 * dVar65 + dVar4 * dVar66) * 2.0
  ;
  dVar74 = (dVar19 * dVar45 +
           dVar18 * dVar44 +
           dVar17 * dVar43 +
           dVar16 * dVar42 + dVar15 * dVar41 + dVar14 * dVar40 + dVar12 * dVar38 + dVar13 * dVar39)
           * 2.0;
  dVar75 = (dVar19 * dVar54 +
           dVar18 * dVar53 +
           dVar17 * dVar52 +
           dVar16 * dVar51 + dVar15 * dVar50 + dVar14 * dVar49 + dVar12 * dVar47 + dVar13 * dVar48)
           * 2.0;
  dVar76 = (dVar19 * dVar63 +
           dVar18 * dVar62 +
           dVar17 * dVar61 +
           dVar16 * dVar60 + dVar15 * dVar59 + dVar14 * dVar58 + dVar12 * dVar56 + dVar13 * dVar57)
           * 2.0;
  dVar77 = (dVar19 * dVar72 +
           dVar18 * dVar71 +
           dVar17 * dVar70 +
           dVar16 * dVar69 + dVar15 * dVar68 + dVar14 * dVar67 + dVar12 * dVar65 + dVar13 * dVar66)
           * 2.0;
  dVar78 = (dVar28 * dVar45 +
           dVar27 * dVar44 +
           dVar26 * dVar43 +
           dVar25 * dVar42 + dVar24 * dVar41 + dVar23 * dVar40 + dVar21 * dVar38 + dVar22 * dVar39)
           * 2.0;
  dVar79 = (dVar28 * dVar54 +
           dVar27 * dVar53 +
           dVar26 * dVar52 +
           dVar25 * dVar51 + dVar24 * dVar50 + dVar23 * dVar49 + dVar21 * dVar47 + dVar22 * dVar48)
           * 2.0;
  dVar80 = (dVar28 * dVar63 +
           dVar27 * dVar62 +
           dVar26 * dVar61 +
           dVar25 * dVar60 + dVar24 * dVar59 + dVar23 * dVar58 + dVar21 * dVar56 + dVar22 * dVar57)
           * 2.0;
  dVar81 = (dVar28 * dVar72 +
           dVar27 * dVar71 +
           dVar26 * dVar70 +
           dVar25 * dVar69 + dVar24 * dVar68 + dVar23 * dVar67 + dVar21 * dVar65 + dVar22 * dVar66)
           * 2.0;
  dVar82 = dVar79 * (dVar64 * dVar77 + -(dVar73 * dVar76)) +
           dVar55 * (dVar76 * dVar81 + -(dVar77 * dVar80)) +
           -(dVar75 * (dVar64 * dVar81 + -(dVar73 * dVar80)));
  dVar1 = -(dVar78 * (dVar64 * dVar77 + -(dVar73 * dVar76)) +
           dVar46 * (dVar76 * dVar81 + -(dVar77 * dVar80)) +
           -(dVar74 * (dVar64 * dVar81 + -(dVar73 * dVar80))));
  dVar83 = dVar78 * (dVar55 * dVar77 + -(dVar73 * dVar75)) +
           dVar46 * (dVar75 * dVar81 + -(dVar77 * dVar79)) +
           -(dVar74 * (dVar55 * dVar81 + -(dVar73 * dVar79)));
  dVar2 = -(dVar78 * (dVar55 * dVar76 + -(dVar64 * dVar75)) +
           dVar46 * (dVar75 * dVar80 + -(dVar76 * dVar79)) +
           -(dVar74 * (dVar55 * dVar80 + -(dVar64 * dVar79))));
  dVar84 = dVar82 + dVar1 + dVar83 + dVar2;
  dVar1 = dVar84 * (dVar37 * dVar37 +
                   dVar36 * dVar36 +
                   dVar35 * dVar35 +
                   dVar34 * dVar34 +
                   dVar33 * dVar33 + dVar32 * dVar32 + dVar30 * dVar30 + dVar31 * dVar31) * 1.0 +
          -((dVar37 * dVar72 +
            dVar36 * dVar71 +
            dVar35 * dVar70 +
            dVar34 * dVar69 + dVar33 * dVar68 + dVar32 * dVar67 + dVar30 * dVar65 + dVar31 * dVar66)
            * 2.0 * ((dVar55 * dVar76 + -(dVar64 * dVar75) + dVar64 * dVar74 + -(dVar46 * dVar76) +
                     dVar46 * dVar75 + -(dVar55 * dVar74)) * dVar29 +
                     (dVar75 * dVar80 + -(dVar76 * dVar79) + dVar76 * dVar78 + -(dVar74 * dVar80) +
                     dVar74 * dVar79 + -(dVar75 * dVar78)) * dVar11 +
                     -(dVar55 * dVar80 + -(dVar64 * dVar79) + dVar64 * dVar78 + -(dVar46 * dVar80) +
                      dVar46 * dVar79 + -(dVar55 * dVar78)) * dVar20 + dVar2) +
           (dVar37 * dVar63 +
           dVar36 * dVar62 +
           dVar35 * dVar61 +
           dVar34 * dVar60 + dVar33 * dVar59 + dVar32 * dVar58 + dVar30 * dVar56 + dVar31 * dVar57)
           * 2.0 * (-(dVar55 * dVar77 + -(dVar73 * dVar75) + dVar73 * dVar74 + -(dVar46 * dVar77) +
                     dVar46 * dVar75 + -(dVar55 * dVar74)) * dVar29 +
                    -(dVar75 * dVar81 + -(dVar77 * dVar79) + dVar77 * dVar78 + -(dVar74 * dVar81) +
                     dVar74 * dVar79 + -(dVar75 * dVar78)) * dVar11 +
                    (dVar55 * dVar81 + -(dVar73 * dVar79) + dVar73 * dVar78 + -(dVar46 * dVar81) +
                    dVar46 * dVar79 + -(dVar55 * dVar78)) * dVar20 + dVar83) +
           (dVar37 * dVar45 +
           dVar36 * dVar44 +
           dVar35 * dVar43 +
           dVar34 * dVar42 + dVar33 * dVar41 + dVar32 * dVar40 + dVar30 * dVar38 + dVar31 * dVar39)
           * 2.0 * (-(dVar64 * dVar77 + -(dVar73 * dVar76) + dVar73 * dVar75 + -(dVar55 * dVar77) +
                     dVar55 * dVar76 + -(dVar64 * dVar75)) * dVar29 +
                    -(dVar76 * dVar81 + -(dVar77 * dVar80) + dVar77 * dVar79 + -(dVar75 * dVar81) +
                     dVar75 * dVar80 + -(dVar76 * dVar79)) * dVar11 +
                    (dVar64 * dVar81 + -(dVar73 * dVar80) + dVar73 * dVar79 + -(dVar55 * dVar81) +
                    dVar55 * dVar80 + -(dVar64 * dVar79)) * dVar20 + dVar82) +
           (dVar37 * dVar54 +
           dVar36 * dVar53 +
           dVar35 * dVar52 +
           dVar34 * dVar51 + dVar33 * dVar50 + dVar32 * dVar49 + dVar30 * dVar47 + dVar31 * dVar48)
           * 2.0 * ((dVar64 * dVar77 + -(dVar73 * dVar76) + dVar73 * dVar74 + -(dVar46 * dVar77) +
                    dVar46 * dVar76 + -(dVar64 * dVar74)) * dVar29 +
                    (dVar76 * dVar81 + -(dVar77 * dVar80) + dVar77 * dVar78 + -(dVar74 * dVar81) +
                    dVar74 * dVar80 + -(dVar76 * dVar78)) * dVar11 +
                    -(dVar64 * dVar81 + -(dVar73 * dVar80) + dVar73 * dVar78 + -(dVar46 * dVar81) +
                     dVar46 * dVar80 + -(dVar64 * dVar78)) * dVar20 + dVar1));
  max2 = ABS(dVar17);
  if (max2 < ABS(dVar15)) {
    max2 = ABS(dVar15);
  }
  if (max2 < ABS(dVar12)) {
    max2 = ABS(dVar12);
  }
  if (max2 < ABS(dVar13)) {
    max2 = ABS(dVar13);
  }
  if (max2 < ABS(dVar18)) {
    max2 = ABS(dVar18);
  }
  if (max2 < ABS(dVar14)) {
    max2 = ABS(dVar14);
  }
  if (max2 < ABS(dVar16)) {
    max2 = ABS(dVar16);
  }
  if (max2 < ABS(dVar19)) {
    max2 = ABS(dVar19);
  }
  max3 = ABS(dVar7);
  if (max3 < ABS(dVar6)) {
    max3 = ABS(dVar6);
  }
  if (max3 < ABS(dVar10)) {
    max3 = ABS(dVar10);
  }
  if (max3 < ABS(dVar3)) {
    max3 = ABS(dVar3);
  }
  if (max3 < ABS(dVar5)) {
    max3 = ABS(dVar5);
  }
  if (max3 < ABS(dVar8)) {
    max3 = ABS(dVar8);
  }
  if (max3 < ABS(dVar4)) {
    max3 = ABS(dVar4);
  }
  if (max3 < ABS(dVar9)) {
    max3 = ABS(dVar9);
  }
  max4 = ABS(dVar24);
  if (max4 < ABS(dVar21)) {
    max4 = ABS(dVar21);
  }
  if (max4 < ABS(dVar22)) {
    max4 = ABS(dVar22);
  }
  if (max4 < ABS(dVar23)) {
    max4 = ABS(dVar23);
  }
  if (max4 < ABS(dVar25)) {
    max4 = ABS(dVar25);
  }
  if (max4 < ABS(dVar26)) {
    max4 = ABS(dVar26);
  }
  if (max4 < ABS(dVar27)) {
    max4 = ABS(dVar27);
  }
  if (max4 < ABS(dVar28)) {
    max4 = ABS(dVar28);
  }
  max5 = ABS(dVar38);
  if (max5 < ABS(dVar39)) {
    max5 = ABS(dVar39);
  }
  if (max5 < ABS(dVar40)) {
    max5 = ABS(dVar40);
  }
  if (max5 < ABS(dVar41)) {
    max5 = ABS(dVar41);
  }
  if (max5 < ABS(dVar42)) {
    max5 = ABS(dVar42);
  }
  if (max5 < ABS(dVar43)) {
    max5 = ABS(dVar43);
  }
  if (max5 < ABS(dVar44)) {
    max5 = ABS(dVar44);
  }
  if (max5 < ABS(dVar45)) {
    max5 = ABS(dVar45);
  }
  if (max5 < ABS(dVar47)) {
    max5 = ABS(dVar47);
  }
  if (max5 < ABS(dVar48)) {
    max5 = ABS(dVar48);
  }
  if (max5 < ABS(dVar49)) {
    max5 = ABS(dVar49);
  }
  if (max5 < ABS(dVar50)) {
    max5 = ABS(dVar50);
  }
  if (max5 < ABS(dVar51)) {
    max5 = ABS(dVar51);
  }
  if (max5 < ABS(dVar52)) {
    max5 = ABS(dVar52);
  }
  if (max5 < ABS(dVar53)) {
    max5 = ABS(dVar53);
  }
  if (max5 < ABS(dVar54)) {
    max5 = ABS(dVar54);
  }
  max6 = ABS(dVar47);
  if (max6 < ABS(dVar48)) {
    max6 = ABS(dVar48);
  }
  if (max6 < ABS(dVar49)) {
    max6 = ABS(dVar49);
  }
  if (max6 < ABS(dVar50)) {
    max6 = ABS(dVar50);
  }
  if (max6 < ABS(dVar51)) {
    max6 = ABS(dVar51);
  }
  if (max6 < ABS(dVar52)) {
    max6 = ABS(dVar52);
  }
  if (max6 < ABS(dVar53)) {
    max6 = ABS(dVar53);
  }
  if (max6 < ABS(dVar54)) {
    max6 = ABS(dVar54);
  }
  if (max6 < ABS(dVar56)) {
    max6 = ABS(dVar56);
  }
  if (max6 < ABS(dVar57)) {
    max6 = ABS(dVar57);
  }
  if (max6 < ABS(dVar58)) {
    max6 = ABS(dVar58);
  }
  if (max6 < ABS(dVar59)) {
    max6 = ABS(dVar59);
  }
  if (max6 < ABS(dVar60)) {
    max6 = ABS(dVar60);
  }
  if (max6 < ABS(dVar61)) {
    max6 = ABS(dVar61);
  }
  if (max6 < ABS(dVar62)) {
    max6 = ABS(dVar62);
  }
  if (max6 < ABS(dVar63)) {
    max6 = ABS(dVar63);
  }
  lower_bound_1 = ABS(dVar56);
  if (lower_bound_1 < ABS(dVar57)) {
    lower_bound_1 = ABS(dVar57);
  }
  if (lower_bound_1 < ABS(dVar58)) {
    lower_bound_1 = ABS(dVar58);
  }
  if (lower_bound_1 < ABS(dVar59)) {
    lower_bound_1 = ABS(dVar59);
  }
  if (lower_bound_1 < ABS(dVar60)) {
    lower_bound_1 = ABS(dVar60);
  }
  if (lower_bound_1 < ABS(dVar61)) {
    lower_bound_1 = ABS(dVar61);
  }
  if (lower_bound_1 < ABS(dVar62)) {
    lower_bound_1 = ABS(dVar62);
  }
  if (lower_bound_1 < ABS(dVar63)) {
    lower_bound_1 = ABS(dVar63);
  }
  if (lower_bound_1 < ABS(dVar65)) {
    lower_bound_1 = ABS(dVar65);
  }
  if (lower_bound_1 < ABS(dVar66)) {
    lower_bound_1 = ABS(dVar66);
  }
  if (lower_bound_1 < ABS(dVar67)) {
    lower_bound_1 = ABS(dVar67);
  }
  if (lower_bound_1 < ABS(dVar68)) {
    lower_bound_1 = ABS(dVar68);
  }
  if (lower_bound_1 < ABS(dVar69)) {
    lower_bound_1 = ABS(dVar69);
  }
  if (lower_bound_1 < ABS(dVar70)) {
    lower_bound_1 = ABS(dVar70);
  }
  if (lower_bound_1 < ABS(dVar71)) {
    lower_bound_1 = ABS(dVar71);
  }
  if (lower_bound_1 < ABS(dVar72)) {
    lower_bound_1 = ABS(dVar72);
  }
  upper_bound_1 = max5;
  _int_tmp_result = max5;
  if (max5 <= max2) {
    if (max5 < max2) {
      _int_tmp_result = max2;
    }
  }
  else {
    upper_bound_1 = max2;
  }
  if (upper_bound_1 <= max4) {
    if (_int_tmp_result < max4) {
      _int_tmp_result = max4;
    }
  }
  else {
    upper_bound_1 = max4;
  }
  if (upper_bound_1 <= max3) {
    if (_int_tmp_result < max3) {
      _int_tmp_result = max3;
    }
  }
  else {
    upper_bound_1 = max3;
  }
  if (upper_bound_1 <= lower_bound_1) {
    if (_int_tmp_result < lower_bound_1) {
      _int_tmp_result = lower_bound_1;
    }
  }
  else {
    upper_bound_1 = lower_bound_1;
  }
  if (upper_bound_1 <= max6) {
    if (_int_tmp_result < max6) {
      _int_tmp_result = max6;
    }
  }
  else {
    upper_bound_1 = max6;
  }
  if (2.825284831947541e-50 <= upper_bound_1) {
    if (_int_tmp_result <= 4.8357032784585156e+24) {
      dVar2 = max3 * max5 * max2 * max6 * max4 * lower_bound_1 * 4.3749289469473104e-11;
      if (dVar84 <= dVar2) {
        if (-dVar2 <= dVar84) {
          return 0;
        }
        local_3e0 = -1;
      }
      else {
        local_3e0 = 1;
      }
      max8 = max2;
      if (max2 < max4) {
        max8 = max4;
      }
      max9 = max3;
      if (max3 < ABS(dVar33)) {
        max9 = ABS(dVar33);
      }
      if (max9 < ABS(dVar31)) {
        max9 = ABS(dVar31);
      }
      if (max9 < ABS(dVar34)) {
        max9 = ABS(dVar34);
      }
      if (max9 < ABS(dVar30)) {
        max9 = ABS(dVar30);
      }
      if (max9 < ABS(dVar32)) {
        max9 = ABS(dVar32);
      }
      if (max9 < ABS(dVar35)) {
        max9 = ABS(dVar35);
      }
      if (max9 < ABS(dVar36)) {
        max9 = ABS(dVar36);
      }
      if (max9 < ABS(dVar37)) {
        max9 = ABS(dVar37);
      }
      if (max8 < max9) {
        max8 = max9;
      }
      if (max8 < max3) {
        max8 = max3;
      }
      if (max8 < lower_bound_1) {
        max8 = lower_bound_1;
      }
      max10 = max9;
      if (max9 < max3) {
        max10 = max3;
      }
      if (max10 < max6) {
        max10 = max6;
      }
      max11 = max5;
      local_410 = max5;
      if (max5 < max6) {
        local_410 = max6;
      }
      if (max5 < local_410) {
        max11 = local_410;
      }
      if (max11 < max3) {
        max11 = max3;
      }
      if (max11 < lower_bound_1) {
        max11 = lower_bound_1;
      }
      if (max11 < max6) {
        max11 = max6;
      }
      upper_bound_1 = local_410;
      _int_tmp_result = local_410;
      if (local_410 <= max10) {
        if (local_410 < max10) {
          _int_tmp_result = max10;
        }
      }
      else {
        upper_bound_1 = max10;
      }
      if (upper_bound_1 <= max8) {
        if (_int_tmp_result < max8) {
          _int_tmp_result = max8;
        }
      }
      else {
        upper_bound_1 = max8;
      }
      if (max2 < upper_bound_1) {
        upper_bound_1 = max2;
      }
      if (max4 < upper_bound_1) {
        upper_bound_1 = max4;
      }
      if (max9 < upper_bound_1) {
        upper_bound_1 = max9;
      }
      if (upper_bound_1 <= max11) {
        if (_int_tmp_result < max11) {
          _int_tmp_result = max11;
        }
      }
      else {
        upper_bound_1 = max11;
      }
      if (4.1740251859728477e-38 <= upper_bound_1) {
        if (_int_tmp_result <= 4.8357032784585156e+24) {
          dVar2 = max9 * local_410 * max2 * max11 * max4 * max11 * max10 * max8 *
                  2.4149264560725403e-09;
          if (dVar1 <= dVar2) {
            if (-dVar2 <= dVar1) {
              return 0;
            }
            max7._4_4_ = -1;
          }
          else {
            max7._4_4_ = 1;
          }
          p0_local._4_4_ = local_3e0 * max7._4_4_;
        }
        else {
          p0_local._4_4_ = 0;
        }
      }
      else {
        p0_local._4_4_ = 0;
      }
    }
    else {
      p0_local._4_4_ = 0;
    }
  }
  else {
    p0_local._4_4_ = 0;
  }
  return p0_local._4_4_;
}

Assistant:

inline int side4_8d_filter( const double* p0, const double* p1, const double* p2, const double* p3, const double* p4, const double* q0, const double* q1, const double* q2, const double* q3) {
    double p1_0_p0_0 = (p1[0] - p0[0]);
    double p1_1_p0_1 = (p1[1] - p0[1]);
    double p1_2_p0_2 = (p1[2] - p0[2]);
    double p1_3_p0_3 = (p1[3] - p0[3]);
    double p1_4_p0_4 = (p1[4] - p0[4]);
    double p1_5_p0_5 = (p1[5] - p0[5]);
    double p1_6_p0_6 = (p1[6] - p0[6]);
    double p1_7_p0_7 = (p1[7] - p0[7]);
    double l1;
    l1 = (1 * ((((((((p1_0_p0_0 * p1_0_p0_0) + (p1_1_p0_1 * p1_1_p0_1)) + (p1_2_p0_2 * p1_2_p0_2)) + (p1_3_p0_3 * p1_3_p0_3)) + (p1_4_p0_4 * p1_4_p0_4)) + (p1_5_p0_5 * p1_5_p0_5)) + (p1_6_p0_6 * p1_6_p0_6)) + (p1_7_p0_7 * p1_7_p0_7)));
    double p2_0_p0_0 = (p2[0] - p0[0]);
    double p2_1_p0_1 = (p2[1] - p0[1]);
    double p2_2_p0_2 = (p2[2] - p0[2]);
    double p2_3_p0_3 = (p2[3] - p0[3]);
    double p2_4_p0_4 = (p2[4] - p0[4]);
    double p2_5_p0_5 = (p2[5] - p0[5]);
    double p2_6_p0_6 = (p2[6] - p0[6]);
    double p2_7_p0_7 = (p2[7] - p0[7]);
    double l2;
    l2 = (1 * ((((((((p2_0_p0_0 * p2_0_p0_0) + (p2_1_p0_1 * p2_1_p0_1)) + (p2_2_p0_2 * p2_2_p0_2)) + (p2_3_p0_3 * p2_3_p0_3)) + (p2_4_p0_4 * p2_4_p0_4)) + (p2_5_p0_5 * p2_5_p0_5)) + (p2_6_p0_6 * p2_6_p0_6)) + (p2_7_p0_7 * p2_7_p0_7)));
    double p3_0_p0_0 = (p3[0] - p0[0]);
    double p3_1_p0_1 = (p3[1] - p0[1]);
    double p3_2_p0_2 = (p3[2] - p0[2]);
    double p3_3_p0_3 = (p3[3] - p0[3]);
    double p3_4_p0_4 = (p3[4] - p0[4]);
    double p3_5_p0_5 = (p3[5] - p0[5]);
    double p3_6_p0_6 = (p3[6] - p0[6]);
    double p3_7_p0_7 = (p3[7] - p0[7]);
    double l3;
    l3 = (1 * ((((((((p3_0_p0_0 * p3_0_p0_0) + (p3_1_p0_1 * p3_1_p0_1)) + (p3_2_p0_2 * p3_2_p0_2)) + (p3_3_p0_3 * p3_3_p0_3)) + (p3_4_p0_4 * p3_4_p0_4)) + (p3_5_p0_5 * p3_5_p0_5)) + (p3_6_p0_6 * p3_6_p0_6)) + (p3_7_p0_7 * p3_7_p0_7)));
    double p4_0_p0_0 = (p4[0] - p0[0]);
    double p4_1_p0_1 = (p4[1] - p0[1]);
    double p4_2_p0_2 = (p4[2] - p0[2]);
    double p4_3_p0_3 = (p4[3] - p0[3]);
    double p4_4_p0_4 = (p4[4] - p0[4]);
    double p4_5_p0_5 = (p4[5] - p0[5]);
    double p4_6_p0_6 = (p4[6] - p0[6]);
    double p4_7_p0_7 = (p4[7] - p0[7]);
    double l4;
    l4 = (1 * ((((((((p4_0_p0_0 * p4_0_p0_0) + (p4_1_p0_1 * p4_1_p0_1)) + (p4_2_p0_2 * p4_2_p0_2)) + (p4_3_p0_3 * p4_3_p0_3)) + (p4_4_p0_4 * p4_4_p0_4)) + (p4_5_p0_5 * p4_5_p0_5)) + (p4_6_p0_6 * p4_6_p0_6)) + (p4_7_p0_7 * p4_7_p0_7)));
    double q0_0_p0_0 = (q0[0] - p0[0]);
    double q0_1_p0_1 = (q0[1] - p0[1]);
    double q0_2_p0_2 = (q0[2] - p0[2]);
    double q0_3_p0_3 = (q0[3] - p0[3]);
    double q0_4_p0_4 = (q0[4] - p0[4]);
    double q0_5_p0_5 = (q0[5] - p0[5]);
    double q0_6_p0_6 = (q0[6] - p0[6]);
    double q0_7_p0_7 = (q0[7] - p0[7]);
    double a10;
    a10 = (2 * ((((((((p1_0_p0_0 * q0_0_p0_0) + (p1_1_p0_1 * q0_1_p0_1)) + (p1_2_p0_2 * q0_2_p0_2)) + (p1_3_p0_3 * q0_3_p0_3)) + (p1_4_p0_4 * q0_4_p0_4)) + (p1_5_p0_5 * q0_5_p0_5)) + (p1_6_p0_6 * q0_6_p0_6)) + (p1_7_p0_7 * q0_7_p0_7)));
    double q1_0_p0_0 = (q1[0] - p0[0]);
    double q1_1_p0_1 = (q1[1] - p0[1]);
    double q1_2_p0_2 = (q1[2] - p0[2]);
    double q1_3_p0_3 = (q1[3] - p0[3]);
    double q1_4_p0_4 = (q1[4] - p0[4]);
    double q1_5_p0_5 = (q1[5] - p0[5]);
    double q1_6_p0_6 = (q1[6] - p0[6]);
    double q1_7_p0_7 = (q1[7] - p0[7]);
    double a11;
    a11 = (2 * ((((((((p1_0_p0_0 * q1_0_p0_0) + (p1_1_p0_1 * q1_1_p0_1)) + (p1_2_p0_2 * q1_2_p0_2)) + (p1_3_p0_3 * q1_3_p0_3)) + (p1_4_p0_4 * q1_4_p0_4)) + (p1_5_p0_5 * q1_5_p0_5)) + (p1_6_p0_6 * q1_6_p0_6)) + (p1_7_p0_7 * q1_7_p0_7)));
    double q2_0_p0_0 = (q2[0] - p0[0]);
    double q2_1_p0_1 = (q2[1] - p0[1]);
    double q2_2_p0_2 = (q2[2] - p0[2]);
    double q2_3_p0_3 = (q2[3] - p0[3]);
    double q2_4_p0_4 = (q2[4] - p0[4]);
    double q2_5_p0_5 = (q2[5] - p0[5]);
    double q2_6_p0_6 = (q2[6] - p0[6]);
    double q2_7_p0_7 = (q2[7] - p0[7]);
    double a12;
    a12 = (2 * ((((((((p1_0_p0_0 * q2_0_p0_0) + (p1_1_p0_1 * q2_1_p0_1)) + (p1_2_p0_2 * q2_2_p0_2)) + (p1_3_p0_3 * q2_3_p0_3)) + (p1_4_p0_4 * q2_4_p0_4)) + (p1_5_p0_5 * q2_5_p0_5)) + (p1_6_p0_6 * q2_6_p0_6)) + (p1_7_p0_7 * q2_7_p0_7)));
    double q3_0_p0_0 = (q3[0] - p0[0]);
    double q3_1_p0_1 = (q3[1] - p0[1]);
    double q3_2_p0_2 = (q3[2] - p0[2]);
    double q3_3_p0_3 = (q3[3] - p0[3]);
    double q3_4_p0_4 = (q3[4] - p0[4]);
    double q3_5_p0_5 = (q3[5] - p0[5]);
    double q3_6_p0_6 = (q3[6] - p0[6]);
    double q3_7_p0_7 = (q3[7] - p0[7]);
    double a13;
    a13 = (2 * ((((((((p1_0_p0_0 * q3_0_p0_0) + (p1_1_p0_1 * q3_1_p0_1)) + (p1_2_p0_2 * q3_2_p0_2)) + (p1_3_p0_3 * q3_3_p0_3)) + (p1_4_p0_4 * q3_4_p0_4)) + (p1_5_p0_5 * q3_5_p0_5)) + (p1_6_p0_6 * q3_6_p0_6)) + (p1_7_p0_7 * q3_7_p0_7)));
    double a20;
    a20 = (2 * ((((((((p2_0_p0_0 * q0_0_p0_0) + (p2_1_p0_1 * q0_1_p0_1)) + (p2_2_p0_2 * q0_2_p0_2)) + (p2_3_p0_3 * q0_3_p0_3)) + (p2_4_p0_4 * q0_4_p0_4)) + (p2_5_p0_5 * q0_5_p0_5)) + (p2_6_p0_6 * q0_6_p0_6)) + (p2_7_p0_7 * q0_7_p0_7)));
    double a21;
    a21 = (2 * ((((((((p2_0_p0_0 * q1_0_p0_0) + (p2_1_p0_1 * q1_1_p0_1)) + (p2_2_p0_2 * q1_2_p0_2)) + (p2_3_p0_3 * q1_3_p0_3)) + (p2_4_p0_4 * q1_4_p0_4)) + (p2_5_p0_5 * q1_5_p0_5)) + (p2_6_p0_6 * q1_6_p0_6)) + (p2_7_p0_7 * q1_7_p0_7)));
    double a22;
    a22 = (2 * ((((((((p2_0_p0_0 * q2_0_p0_0) + (p2_1_p0_1 * q2_1_p0_1)) + (p2_2_p0_2 * q2_2_p0_2)) + (p2_3_p0_3 * q2_3_p0_3)) + (p2_4_p0_4 * q2_4_p0_4)) + (p2_5_p0_5 * q2_5_p0_5)) + (p2_6_p0_6 * q2_6_p0_6)) + (p2_7_p0_7 * q2_7_p0_7)));
    double a23;
    a23 = (2 * ((((((((p2_0_p0_0 * q3_0_p0_0) + (p2_1_p0_1 * q3_1_p0_1)) + (p2_2_p0_2 * q3_2_p0_2)) + (p2_3_p0_3 * q3_3_p0_3)) + (p2_4_p0_4 * q3_4_p0_4)) + (p2_5_p0_5 * q3_5_p0_5)) + (p2_6_p0_6 * q3_6_p0_6)) + (p2_7_p0_7 * q3_7_p0_7)));
    double a30;
    a30 = (2 * ((((((((p3_0_p0_0 * q0_0_p0_0) + (p3_1_p0_1 * q0_1_p0_1)) + (p3_2_p0_2 * q0_2_p0_2)) + (p3_3_p0_3 * q0_3_p0_3)) + (p3_4_p0_4 * q0_4_p0_4)) + (p3_5_p0_5 * q0_5_p0_5)) + (p3_6_p0_6 * q0_6_p0_6)) + (p3_7_p0_7 * q0_7_p0_7)));
    double a31;
    a31 = (2 * ((((((((p3_0_p0_0 * q1_0_p0_0) + (p3_1_p0_1 * q1_1_p0_1)) + (p3_2_p0_2 * q1_2_p0_2)) + (p3_3_p0_3 * q1_3_p0_3)) + (p3_4_p0_4 * q1_4_p0_4)) + (p3_5_p0_5 * q1_5_p0_5)) + (p3_6_p0_6 * q1_6_p0_6)) + (p3_7_p0_7 * q1_7_p0_7)));
    double a32;
    a32 = (2 * ((((((((p3_0_p0_0 * q2_0_p0_0) + (p3_1_p0_1 * q2_1_p0_1)) + (p3_2_p0_2 * q2_2_p0_2)) + (p3_3_p0_3 * q2_3_p0_3)) + (p3_4_p0_4 * q2_4_p0_4)) + (p3_5_p0_5 * q2_5_p0_5)) + (p3_6_p0_6 * q2_6_p0_6)) + (p3_7_p0_7 * q2_7_p0_7)));
    double a33;
    a33 = (2 * ((((((((p3_0_p0_0 * q3_0_p0_0) + (p3_1_p0_1 * q3_1_p0_1)) + (p3_2_p0_2 * q3_2_p0_2)) + (p3_3_p0_3 * q3_3_p0_3)) + (p3_4_p0_4 * q3_4_p0_4)) + (p3_5_p0_5 * q3_5_p0_5)) + (p3_6_p0_6 * q3_6_p0_6)) + (p3_7_p0_7 * q3_7_p0_7)));
    double a40;
    a40 = (2 * ((((((((p4_0_p0_0 * q0_0_p0_0) + (p4_1_p0_1 * q0_1_p0_1)) + (p4_2_p0_2 * q0_2_p0_2)) + (p4_3_p0_3 * q0_3_p0_3)) + (p4_4_p0_4 * q0_4_p0_4)) + (p4_5_p0_5 * q0_5_p0_5)) + (p4_6_p0_6 * q0_6_p0_6)) + (p4_7_p0_7 * q0_7_p0_7)));
    double a41;
    a41 = (2 * ((((((((p4_0_p0_0 * q1_0_p0_0) + (p4_1_p0_1 * q1_1_p0_1)) + (p4_2_p0_2 * q1_2_p0_2)) + (p4_3_p0_3 * q1_3_p0_3)) + (p4_4_p0_4 * q1_4_p0_4)) + (p4_5_p0_5 * q1_5_p0_5)) + (p4_6_p0_6 * q1_6_p0_6)) + (p4_7_p0_7 * q1_7_p0_7)));
    double a42;
    a42 = (2 * ((((((((p4_0_p0_0 * q2_0_p0_0) + (p4_1_p0_1 * q2_1_p0_1)) + (p4_2_p0_2 * q2_2_p0_2)) + (p4_3_p0_3 * q2_3_p0_3)) + (p4_4_p0_4 * q2_4_p0_4)) + (p4_5_p0_5 * q2_5_p0_5)) + (p4_6_p0_6 * q2_6_p0_6)) + (p4_7_p0_7 * q2_7_p0_7)));
    double a43;
    a43 = (2 * ((((((((p4_0_p0_0 * q3_0_p0_0) + (p4_1_p0_1 * q3_1_p0_1)) + (p4_2_p0_2 * q3_2_p0_2)) + (p4_3_p0_3 * q3_3_p0_3)) + (p4_4_p0_4 * q3_4_p0_4)) + (p4_5_p0_5 * q3_5_p0_5)) + (p4_6_p0_6 * q3_6_p0_6)) + (p4_7_p0_7 * q3_7_p0_7)));
    double b00;
    b00 = (((a11 * ((a22 * a33) - (a23 * a32))) - (a21 * ((a12 * a33) - (a13 * a32)))) + (a31 * ((a12 * a23) - (a13 * a22))));
    double b01;
    b01 = -((((a22 * a33) - (a23 * a32)) + ((a23 * a31) - (a21 * a33))) + ((a21 * a32) - (a22 * a31)));
    double b02;
    b02 = ((((a12 * a33) - (a13 * a32)) + ((a13 * a31) - (a11 * a33))) + ((a11 * a32) - (a12 * a31)));
    double b03;
    b03 = -((((a12 * a23) - (a13 * a22)) + ((a13 * a21) - (a11 * a23))) + ((a11 * a22) - (a12 * a21)));
    double b10;
    b10 = -(((a10 * ((a22 * a33) - (a23 * a32))) - (a20 * ((a12 * a33) - (a13 * a32)))) + (a30 * ((a12 * a23) - (a13 * a22))));
    double b11;
    b11 = ((((a22 * a33) - (a23 * a32)) + ((a23 * a30) - (a20 * a33))) + ((a20 * a32) - (a22 * a30)));
    double b12;
    b12 = -((((a12 * a33) - (a13 * a32)) + ((a13 * a30) - (a10 * a33))) + ((a10 * a32) - (a12 * a30)));
    double b13;
    b13 = ((((a12 * a23) - (a13 * a22)) + ((a13 * a20) - (a10 * a23))) + ((a10 * a22) - (a12 * a20)));
    double b20;
    b20 = (((a10 * ((a21 * a33) - (a23 * a31))) - (a20 * ((a11 * a33) - (a13 * a31)))) + (a30 * ((a11 * a23) - (a13 * a21))));
    double b21;
    b21 = -((((a21 * a33) - (a23 * a31)) + ((a23 * a30) - (a20 * a33))) + ((a20 * a31) - (a21 * a30)));
    double b22;
    b22 = ((((a11 * a33) - (a13 * a31)) + ((a13 * a30) - (a10 * a33))) + ((a10 * a31) - (a11 * a30)));
    double b23;
    b23 = -((((a11 * a23) - (a13 * a21)) + ((a13 * a20) - (a10 * a23))) + ((a10 * a21) - (a11 * a20)));
    double b30;
    b30 = -(((a10 * ((a21 * a32) - (a22 * a31))) - (a20 * ((a11 * a32) - (a12 * a31)))) + (a30 * ((a11 * a22) - (a12 * a21))));
    double b31;
    b31 = ((((a21 * a32) - (a22 * a31)) + ((a22 * a30) - (a20 * a32))) + ((a20 * a31) - (a21 * a30)));
    double b32;
    b32 = -((((a11 * a32) - (a12 * a31)) + ((a12 * a30) - (a10 * a32))) + ((a10 * a31) - (a11 * a30)));
    double b33;
    b33 = ((((a11 * a22) - (a12 * a21)) + ((a12 * a20) - (a10 * a22))) + ((a10 * a21) - (a11 * a20)));
    double Delta;
    Delta = (((b00 + b10) + b20) + b30);
    double DeltaLambda0;
    DeltaLambda0 = ((((b01 * l1) + (b02 * l2)) + (b03 * l3)) + b00);
    double DeltaLambda1;
    DeltaLambda1 = ((((b11 * l1) + (b12 * l2)) + (b13 * l3)) + b10);
    double DeltaLambda2;
    DeltaLambda2 = ((((b21 * l1) + (b22 * l2)) + (b23 * l3)) + b20);
    double DeltaLambda3;
    DeltaLambda3 = ((((b31 * l1) + (b32 * l2)) + (b33 * l3)) + b30);
    double r;
    r = ((Delta * l4) - ((((a40 * DeltaLambda0) + (a41 * DeltaLambda1)) + (a42 * DeltaLambda2)) + (a43 * DeltaLambda3)));
    double eps;
    double max1 = fabs(p2_5_p0_5);
    if( (max1 < fabs(p2_3_p0_3)) )
    {
        max1 = fabs(p2_3_p0_3);
    } 
    if( (max1 < fabs(p2_0_p0_0)) )
    {
        max1 = fabs(p2_0_p0_0);
    } 
    if( (max1 < fabs(p2_1_p0_1)) )
    {
        max1 = fabs(p2_1_p0_1);
    } 
    if( (max1 < fabs(p2_6_p0_6)) )
    {
        max1 = fabs(p2_6_p0_6);
    } 
    if( (max1 < fabs(p2_2_p0_2)) )
    {
        max1 = fabs(p2_2_p0_2);
    } 
    if( (max1 < fabs(p2_4_p0_4)) )
    {
        max1 = fabs(p2_4_p0_4);
    } 
    if( (max1 < fabs(p2_7_p0_7)) )
    {
        max1 = fabs(p2_7_p0_7);
    } 
    double max2 = fabs(p1_4_p0_4);
    if( (max2 < fabs(p1_3_p0_3)) )
    {
        max2 = fabs(p1_3_p0_3);
    } 
    if( (max2 < fabs(p1_7_p0_7)) )
    {
        max2 = fabs(p1_7_p0_7);
    } 
    if( (max2 < fabs(p1_0_p0_0)) )
    {
        max2 = fabs(p1_0_p0_0);
    } 
    if( (max2 < fabs(p1_2_p0_2)) )
    {
        max2 = fabs(p1_2_p0_2);
    } 
    if( (max2 < fabs(p1_5_p0_5)) )
    {
        max2 = fabs(p1_5_p0_5);
    } 
    if( (max2 < fabs(p1_1_p0_1)) )
    {
        max2 = fabs(p1_1_p0_1);
    } 
    if( (max2 < fabs(p1_6_p0_6)) )
    {
        max2 = fabs(p1_6_p0_6);
    } 
    double max3 = fabs(p3_3_p0_3);
    if( (max3 < fabs(p3_0_p0_0)) )
    {
        max3 = fabs(p3_0_p0_0);
    } 
    if( (max3 < fabs(p3_1_p0_1)) )
    {
        max3 = fabs(p3_1_p0_1);
    } 
    if( (max3 < fabs(p3_2_p0_2)) )
    {
        max3 = fabs(p3_2_p0_2);
    } 
    if( (max3 < fabs(p3_4_p0_4)) )
    {
        max3 = fabs(p3_4_p0_4);
    } 
    if( (max3 < fabs(p3_5_p0_5)) )
    {
        max3 = fabs(p3_5_p0_5);
    } 
    if( (max3 < fabs(p3_6_p0_6)) )
    {
        max3 = fabs(p3_6_p0_6);
    } 
    if( (max3 < fabs(p3_7_p0_7)) )
    {
        max3 = fabs(p3_7_p0_7);
    } 
    double max4 = fabs(q0_0_p0_0);
    if( (max4 < fabs(q0_1_p0_1)) )
    {
        max4 = fabs(q0_1_p0_1);
    } 
    if( (max4 < fabs(q0_2_p0_2)) )
    {
        max4 = fabs(q0_2_p0_2);
    } 
    if( (max4 < fabs(q0_3_p0_3)) )
    {
        max4 = fabs(q0_3_p0_3);
    } 
    if( (max4 < fabs(q0_4_p0_4)) )
    {
        max4 = fabs(q0_4_p0_4);
    } 
    if( (max4 < fabs(q0_5_p0_5)) )
    {
        max4 = fabs(q0_5_p0_5);
    } 
    if( (max4 < fabs(q0_6_p0_6)) )
    {
        max4 = fabs(q0_6_p0_6);
    } 
    if( (max4 < fabs(q0_7_p0_7)) )
    {
        max4 = fabs(q0_7_p0_7);
    } 
    if( (max4 < fabs(q1_0_p0_0)) )
    {
        max4 = fabs(q1_0_p0_0);
    } 
    if( (max4 < fabs(q1_1_p0_1)) )
    {
        max4 = fabs(q1_1_p0_1);
    } 
    if( (max4 < fabs(q1_2_p0_2)) )
    {
        max4 = fabs(q1_2_p0_2);
    } 
    if( (max4 < fabs(q1_3_p0_3)) )
    {
        max4 = fabs(q1_3_p0_3);
    } 
    if( (max4 < fabs(q1_4_p0_4)) )
    {
        max4 = fabs(q1_4_p0_4);
    } 
    if( (max4 < fabs(q1_5_p0_5)) )
    {
        max4 = fabs(q1_5_p0_5);
    } 
    if( (max4 < fabs(q1_6_p0_6)) )
    {
        max4 = fabs(q1_6_p0_6);
    } 
    if( (max4 < fabs(q1_7_p0_7)) )
    {
        max4 = fabs(q1_7_p0_7);
    } 
    double max5 = fabs(q1_0_p0_0);
    if( (max5 < fabs(q1_1_p0_1)) )
    {
        max5 = fabs(q1_1_p0_1);
    } 
    if( (max5 < fabs(q1_2_p0_2)) )
    {
        max5 = fabs(q1_2_p0_2);
    } 
    if( (max5 < fabs(q1_3_p0_3)) )
    {
        max5 = fabs(q1_3_p0_3);
    } 
    if( (max5 < fabs(q1_4_p0_4)) )
    {
        max5 = fabs(q1_4_p0_4);
    } 
    if( (max5 < fabs(q1_5_p0_5)) )
    {
        max5 = fabs(q1_5_p0_5);
    } 
    if( (max5 < fabs(q1_6_p0_6)) )
    {
        max5 = fabs(q1_6_p0_6);
    } 
    if( (max5 < fabs(q1_7_p0_7)) )
    {
        max5 = fabs(q1_7_p0_7);
    } 
    if( (max5 < fabs(q2_0_p0_0)) )
    {
        max5 = fabs(q2_0_p0_0);
    } 
    if( (max5 < fabs(q2_1_p0_1)) )
    {
        max5 = fabs(q2_1_p0_1);
    } 
    if( (max5 < fabs(q2_2_p0_2)) )
    {
        max5 = fabs(q2_2_p0_2);
    } 
    if( (max5 < fabs(q2_3_p0_3)) )
    {
        max5 = fabs(q2_3_p0_3);
    } 
    if( (max5 < fabs(q2_4_p0_4)) )
    {
        max5 = fabs(q2_4_p0_4);
    } 
    if( (max5 < fabs(q2_5_p0_5)) )
    {
        max5 = fabs(q2_5_p0_5);
    } 
    if( (max5 < fabs(q2_6_p0_6)) )
    {
        max5 = fabs(q2_6_p0_6);
    } 
    if( (max5 < fabs(q2_7_p0_7)) )
    {
        max5 = fabs(q2_7_p0_7);
    } 
    double max6 = fabs(q2_0_p0_0);
    if( (max6 < fabs(q2_1_p0_1)) )
    {
        max6 = fabs(q2_1_p0_1);
    } 
    if( (max6 < fabs(q2_2_p0_2)) )
    {
        max6 = fabs(q2_2_p0_2);
    } 
    if( (max6 < fabs(q2_3_p0_3)) )
    {
        max6 = fabs(q2_3_p0_3);
    } 
    if( (max6 < fabs(q2_4_p0_4)) )
    {
        max6 = fabs(q2_4_p0_4);
    } 
    if( (max6 < fabs(q2_5_p0_5)) )
    {
        max6 = fabs(q2_5_p0_5);
    } 
    if( (max6 < fabs(q2_6_p0_6)) )
    {
        max6 = fabs(q2_6_p0_6);
    } 
    if( (max6 < fabs(q2_7_p0_7)) )
    {
        max6 = fabs(q2_7_p0_7);
    } 
    if( (max6 < fabs(q3_0_p0_0)) )
    {
        max6 = fabs(q3_0_p0_0);
    } 
    if( (max6 < fabs(q3_1_p0_1)) )
    {
        max6 = fabs(q3_1_p0_1);
    } 
    if( (max6 < fabs(q3_2_p0_2)) )
    {
        max6 = fabs(q3_2_p0_2);
    } 
    if( (max6 < fabs(q3_3_p0_3)) )
    {
        max6 = fabs(q3_3_p0_3);
    } 
    if( (max6 < fabs(q3_4_p0_4)) )
    {
        max6 = fabs(q3_4_p0_4);
    } 
    if( (max6 < fabs(q3_5_p0_5)) )
    {
        max6 = fabs(q3_5_p0_5);
    } 
    if( (max6 < fabs(q3_6_p0_6)) )
    {
        max6 = fabs(q3_6_p0_6);
    } 
    if( (max6 < fabs(q3_7_p0_7)) )
    {
        max6 = fabs(q3_7_p0_7);
    } 
    double lower_bound_1;
    double upper_bound_1;
    int Delta_sign;
    int int_tmp_result;
    lower_bound_1 = max4;
    upper_bound_1 = max4;
    if( (max1 < lower_bound_1) )
    {
        lower_bound_1 = max1;
    } 
    else 
    {
        if( (max1 > upper_bound_1) )
        {
            upper_bound_1 = max1;
        } 
    } 
    if( (max3 < lower_bound_1) )
    {
        lower_bound_1 = max3;
    } 
    else 
    {
        if( (max3 > upper_bound_1) )
        {
            upper_bound_1 = max3;
        } 
    } 
    if( (max2 < lower_bound_1) )
    {
        lower_bound_1 = max2;
    } 
    else 
    {
        if( (max2 > upper_bound_1) )
        {
            upper_bound_1 = max2;
        } 
    } 
    if( (max6 < lower_bound_1) )
    {
        lower_bound_1 = max6;
    } 
    else 
    {
        if( (max6 > upper_bound_1) )
        {
            upper_bound_1 = max6;
        } 
    } 
    if( (max5 < lower_bound_1) )
    {
        lower_bound_1 = max5;
    } 
    else 
    {
        if( (max5 > upper_bound_1) )
        {
            upper_bound_1 = max5;
        } 
    } 
    if( (lower_bound_1 < 2.82528483194754087282e-50) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 4.83570327845851562508e+24) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (4.37492894694731040560e-11 * (((((max2 * max4) * max1) * max5) * max3) * max6));
        if( (Delta > eps) )
        {
            int_tmp_result = 1;
        } 
        else 
        {
            if( (Delta < -eps) )
            {
                int_tmp_result = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    Delta_sign = int_tmp_result;
    int int_tmp_result_FFWKCAA;
    double max7 = max1;
    if( (max7 < max3) )
    {
        max7 = max3;
    } 
    double max8 = max2;
    if( (max8 < fabs(p4_3_p0_3)) )
    {
        max8 = fabs(p4_3_p0_3);
    } 
    if( (max8 < fabs(p4_1_p0_1)) )
    {
        max8 = fabs(p4_1_p0_1);
    } 
    if( (max8 < fabs(p4_4_p0_4)) )
    {
        max8 = fabs(p4_4_p0_4);
    } 
    if( (max8 < fabs(p4_0_p0_0)) )
    {
        max8 = fabs(p4_0_p0_0);
    } 
    if( (max8 < fabs(p4_2_p0_2)) )
    {
        max8 = fabs(p4_2_p0_2);
    } 
    if( (max8 < fabs(p4_5_p0_5)) )
    {
        max8 = fabs(p4_5_p0_5);
    } 
    if( (max8 < fabs(p4_6_p0_6)) )
    {
        max8 = fabs(p4_6_p0_6);
    } 
    if( (max8 < fabs(p4_7_p0_7)) )
    {
        max8 = fabs(p4_7_p0_7);
    } 
    if( (max7 < max8) )
    {
        max7 = max8;
    } 
    if( (max7 < max2) )
    {
        max7 = max2;
    } 
    if( (max7 < max6) )
    {
        max7 = max6;
    } 
    double max9 = max8;
    if( (max9 < max2) )
    {
        max9 = max2;
    } 
    if( (max9 < max5) )
    {
        max9 = max5;
    } 
    double max10 = max4;
    double max11 = max4;
    if( (max11 < max5) )
    {
        max11 = max5;
    } 
    if( (max10 < max11) )
    {
        max10 = max11;
    } 
    if( (max10 < max2) )
    {
        max10 = max2;
    } 
    if( (max10 < max6) )
    {
        max10 = max6;
    } 
    if( (max10 < max5) )
    {
        max10 = max5;
    } 
    lower_bound_1 = max11;
    upper_bound_1 = max11;
    if( (max9 < lower_bound_1) )
    {
        lower_bound_1 = max9;
    } 
    else 
    {
        if( (max9 > upper_bound_1) )
        {
            upper_bound_1 = max9;
        } 
    } 
    if( (max7 < lower_bound_1) )
    {
        lower_bound_1 = max7;
    } 
    else 
    {
        if( (max7 > upper_bound_1) )
        {
            upper_bound_1 = max7;
        } 
    } 
    if( (max1 < lower_bound_1) )
    {
        lower_bound_1 = max1;
    } 
    if( (max3 < lower_bound_1) )
    {
        lower_bound_1 = max3;
    } 
    if( (max8 < lower_bound_1) )
    {
        lower_bound_1 = max8;
    } 
    if( (max10 < lower_bound_1) )
    {
        lower_bound_1 = max10;
    } 
    else 
    {
        if( (max10 > upper_bound_1) )
        {
            upper_bound_1 = max10;
        } 
    } 
    if( (lower_bound_1 < 4.17402518597284772324e-38) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 4.83570327845851562508e+24) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (2.41492645607254025015e-09 * (((((((max8 * max11) * max1) * max10) * max3) * max10) * max9) * max7));
        if( (r > eps) )
        {
            int_tmp_result_FFWKCAA = 1;
        } 
        else 
        {
            if( (r < -eps) )
            {
                int_tmp_result_FFWKCAA = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    return (Delta_sign * int_tmp_result_FFWKCAA);
}